

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O3

void highs::parallel::for_each<HEkkDual::majorUpdateFtranParallel()::__0&>
               (HighsInt start,HighsInt end,anon_class_24_3_04dd5b7a *f,HighsInt grainSize)

{
  __atomic_base<int> _Var1;
  double dVar2;
  element_type *peVar3;
  HEkkDual *pHVar4;
  HVector *pHVar5;
  HighsSplitDeque *pHVar6;
  uint uVar7;
  long *plVar8;
  ulong uVar9;
  HighsTimerClock *pHVar10;
  uint32_t uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  TaskGroup tg;
  TaskGroup local_40;
  
  iVar13 = end - start;
  if (grainSize < iVar13) {
    HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
    plVar8 = (long *)__tls_get_addr(&PTR_00441ef0);
    local_40.workerDeque = (HighsSplitDeque *)*plVar8;
    local_40.dequeHead = ((local_40.workerDeque)->ownerData).head;
    do {
      pHVar6 = local_40.workerDeque;
      iVar13 = start + end >> 1;
      uVar7 = ((local_40.workerDeque)->ownerData).head;
      uVar9 = (ulong)uVar7;
      if (uVar9 < 0x2000) {
        uVar11 = (uint32_t)(uVar9 + 1);
        ((local_40.workerDeque)->ownerData).head = uVar11;
        ((local_40.workerDeque)->taskArray)._M_elems[uVar9].metadata.stealer.
        super___atomic_base<unsigned_long>._M_i = 0;
        *(undefined ***)((local_40.workerDeque)->taskArray)._M_elems[uVar9].taskData =
             &PTR_operator___00441508;
        *(int *)(((local_40.workerDeque)->taskArray)._M_elems[uVar9].taskData + 8) = iVar13;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar9].taskData + 0xc) = end;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar9].taskData + 0x10) =
             grainSize;
        *(anon_class_24_3_04dd5b7a **)
         (((local_40.workerDeque)->taskArray)._M_elems[uVar9].taskData + 0x18) = f;
        if (((local_40.workerDeque)->ownerData).allStolenCopy == true) {
          ((local_40.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
               uVar9 << 0x20 | uVar9 + 1;
          ((local_40.workerDeque)->stealerData).allStolen._M_base._M_i = false;
          ((local_40.workerDeque)->ownerData).splitCopy = uVar11;
          ((local_40.workerDeque)->ownerData).allStolenCopy = false;
          if ((((local_40.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
            ((local_40.workerDeque)->splitRequest)._M_base._M_i = false;
          }
          peVar3 = ((local_40.workerDeque)->ownerData).workerBunk.
                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          LOCK();
          _Var1._M_i = (peVar3->haveJobs).super___atomic_base<int>._M_i;
          (peVar3->haveJobs).super___atomic_base<int>._M_i =
               (peVar3->haveJobs).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          if (_Var1._M_i < ((local_40.workerDeque)->ownerData).numWorkers + -1) {
            HighsSplitDeque::WorkerBunk::publishWork
                      (((local_40.workerDeque)->ownerData).workerBunk.
                       super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,local_40.workerDeque);
          }
        }
        else {
          HighsSplitDeque::growShared(local_40.workerDeque);
        }
      }
      else {
        if ((((local_40.workerDeque)->ownerData).splitCopy < 0x2000) &&
           (((local_40.workerDeque)->ownerData).allStolenCopy == false)) {
          HighsSplitDeque::growShared(local_40.workerDeque);
          uVar7 = (pHVar6->ownerData).head;
        }
        (pHVar6->ownerData).head = uVar7 + 1;
        for_each<HEkkDual::majorUpdateFtranParallel()::__0&>(iVar13,end,f,grainSize);
      }
      end = iVar13;
    } while (grainSize < iVar13 - start);
    iVar12 = iVar13 - start;
    if (iVar12 != 0 && start <= iVar13) {
      pHVar4 = f->this;
      lVar14 = (long)start;
      do {
        pHVar5 = (*f->multi_vector)[lVar14];
        dVar2 = (*f->multi_density)[lVar14];
        pHVar10 = HighsSimplexAnalysis::getThreadFactorTimerClockPointer(pHVar4->analysis);
        HSimplexNla::ftran(&pHVar4->ekk_instance_->simplex_nla_,pHVar5,dVar2,pHVar10);
        lVar14 = lVar14 + 1;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    TaskGroup::taskWait(&local_40);
    TaskGroup::~TaskGroup(&local_40);
  }
  else if (start < end) {
    pHVar4 = f->this;
    lVar14 = (long)start;
    do {
      pHVar5 = (*f->multi_vector)[lVar14];
      dVar2 = (*f->multi_density)[lVar14];
      pHVar10 = HighsSimplexAnalysis::getThreadFactorTimerClockPointer(pHVar4->analysis);
      HSimplexNla::ftran(&pHVar4->ekk_instance_->simplex_nla_,pHVar5,dVar2,pHVar10);
      lVar14 = lVar14 + 1;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  return;
}

Assistant:

void for_each(HighsInt start, HighsInt end, F&& f, HighsInt grainSize = 1) {
  if (end - start <= grainSize) {
    f(start, end);
  } else {
    TaskGroup tg;

    do {
      HighsInt split = (start + end) >> 1;
      tg.spawn([split, end, grainSize, &f]() {
        for_each(split, end, f, grainSize);
      });
      end = split;
    } while (end - start > grainSize);

    f(start, end);
    tg.taskWait();
  }
}